

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void google::protobuf::FileDescriptorTables::BuildLocationsByPath
               (pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
                *p)

{
  int iVar1;
  mapped_type *ppSVar2;
  long *in_RDI;
  SourceCodeInfo_Location *loc;
  int len;
  int i;
  SourceCodeInfo_Location *in_stack_ffffffffffffff98;
  int index;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
  *in_stack_ffffffffffffffa0;
  string local_38 [8];
  char *in_stack_ffffffffffffffd0;
  RepeatedField<int> *in_stack_ffffffffffffffd8;
  int local_c;
  
  local_c = 0;
  iVar1 = SourceCodeInfo::location_size((SourceCodeInfo *)0x48faaf);
  for (; index = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20), local_c < iVar1;
      local_c = local_c + 1) {
    SourceCodeInfo::location((SourceCodeInfo *)in_RDI[1]);
    in_stack_ffffffffffffff98 =
         RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::Get
                   ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
                    in_stack_ffffffffffffffa0,index);
    in_stack_ffffffffffffffa0 =
         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
          *)(*in_RDI + 0x178);
    SourceCodeInfo_Location::path((SourceCodeInfo_Location *)0x48fb01);
    Join<google::protobuf::RepeatedField<int>>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    ppSVar2 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
              ::operator[](in_stack_ffffffffffffffa0,(key_type *)in_stack_ffffffffffffff98);
    *ppSVar2 = in_stack_ffffffffffffff98;
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void FileDescriptorTables::BuildLocationsByPath(
    std::pair<const FileDescriptorTables*, const SourceCodeInfo*>* p) {
  for (int i = 0, len = p->second->location_size(); i < len; ++i) {
    const SourceCodeInfo_Location* loc = &p->second->location().Get(i);
    p->first->locations_by_path_[Join(loc->path(), ",")] = loc;
  }
}